

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall
Js::JavascriptArray::EnsureHeadStartsFromZero<double>(JavascriptArray *this,Recycler *recycler)

{
  SparseArraySegmentBase *pSVar1;
  SparseArraySegmentBase *segment;
  SparseArraySegmentBase *ptr;
  
  pSVar1 = (this->head).ptr;
  if ((pSVar1 != (SparseArraySegmentBase *)0x0) && (pSVar1->left == 0)) {
    return;
  }
  ClearSegmentMap(this);
  pSVar1 = (this->head).ptr;
  segment = GetLastUsedSegment(this);
  SetHeadAndLastUsedSegment(this,EmptySegment);
  ptr = &SparseArraySegment<double>::AllocateSegment(recycler,0,0,pSVar1)->
         super_SparseArraySegmentBase;
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(&ptr->next,pSVar1);
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(&this->head,ptr);
  SetHasNoMissingValues(this,true);
  SetLastUsedSegment(this,segment);
  return;
}

Assistant:

void JavascriptArray::EnsureHeadStartsFromZero(Recycler * recycler)
    {
        if (head == nullptr || head->left != 0)
        {
            // This is used to fix up altered arrays.
            // any SegmentMap would be invalid at this point.
            ClearSegmentMap();

            //
            // We could OOM and throw when allocating new empty head, resulting in a corrupted array. Need
            // some protection here. Save the head and switch this array to EmptySegment. Will be restored
            // correctly if allocating new segment succeeds.
            //
            SparseArraySegment<T>* savedHead = SparseArraySegment<T>::From(this->head);
            SparseArraySegment<T>* savedLastUsedSegment = (SparseArraySegment<T>*)this->GetLastUsedSegment();
            SetHeadAndLastUsedSegment(const_cast<SparseArraySegmentBase*>(EmptySegment));

            SparseArraySegment<T> *newSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, 0, savedHead);
            newSeg->next = savedHead;
            this->head = newSeg;
            SetHasNoMissingValues();
            this->SetLastUsedSegment(savedLastUsedSegment);
        }
    }